

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O3

void __thiscall
capnp::Orphan<capnp::DynamicValue>::Orphan<capnp::Text>
          (Orphan<capnp::DynamicValue> *this,Orphan<capnp::Text> *other)

{
  Builder local_70;
  Builder local_30;
  
  _::OrphanBuilder::asText(&local_30,&other->builder);
  local_70.field_1.textValue.content.size_ = local_30.content.size_;
  local_70.field_1.intValue = local_30._0_8_;
  local_70.field_1.textValue.content.ptr = local_30.content.ptr;
  local_70.type = TEXT;
  Orphan(this,&local_70,&other->builder);
  DynamicValue::Builder::~Builder(&local_70);
  return;
}

Assistant:

inline Orphan<DynamicValue>::Orphan(Orphan<T>&& other)
    : Orphan(other.get(), kj::mv(other.builder)) {}